

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcacheoptimizer.cpp
# Opt level: O0

void meshopt::buildTriangleAdjacency
               (TriangleAdjacency *adjacency,uint *indices,size_t index_count,size_t vertex_count,
               meshopt_Allocator *allocator)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  ulong in_RCX;
  undefined4 uVar6;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i_3;
  uint c;
  uint b;
  uint a;
  size_t i_2;
  size_t i_1;
  uint offset;
  size_t i;
  size_t face_count;
  ulong local_68;
  ulong local_50;
  size_t in_stack_ffffffffffffffb8;
  ulong uVar7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar8;
  ulong local_38;
  
  puVar5 = meshopt_Allocator::allocate<unsigned_int>
                     ((meshopt_Allocator *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  *in_RDI = (long)puVar5;
  puVar5 = meshopt_Allocator::allocate<unsigned_int>
                     ((meshopt_Allocator *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  in_RDI[1] = (long)puVar5;
  puVar5 = meshopt_Allocator::allocate<unsigned_int>
                     ((meshopt_Allocator *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffb8);
  in_RDI[2] = (long)puVar5;
  memset((void *)*in_RDI,0,in_RCX << 2);
  for (local_38 = 0; local_38 < in_RDX; local_38 = local_38 + 1) {
    uVar7 = (ulong)*(uint *)(in_RSI + local_38 * 4);
    *(int *)(*in_RDI + uVar7 * 4) = *(int *)(*in_RDI + uVar7 * 4) + 1;
  }
  iVar8 = 0;
  for (uVar7 = 0; uVar7 < in_RCX; uVar7 = uVar7 + 1) {
    *(int *)(in_RDI[1] + uVar7 * 4) = iVar8;
    iVar8 = *(int *)(*in_RDI + uVar7 * 4) + iVar8;
  }
  for (local_50 = 0; local_50 < in_RDX / 3; local_50 = local_50 + 1) {
    uVar1 = *(uint *)(in_RSI + 4 + local_50 * 0xc);
    uVar2 = *(uint *)(in_RSI + 8 + local_50 * 0xc);
    lVar4 = in_RDI[2];
    uVar7 = (ulong)*(uint *)(in_RSI + local_50 * 0xc);
    uVar3 = *(uint *)(in_RDI[1] + uVar7 * 4);
    *(uint *)(in_RDI[1] + uVar7 * 4) = uVar3 + 1;
    uVar6 = (undefined4)local_50;
    *(undefined4 *)(lVar4 + (ulong)uVar3 * 4) = uVar6;
    lVar4 = in_RDI[2];
    uVar7 = (ulong)uVar1;
    uVar1 = *(uint *)(in_RDI[1] + uVar7 * 4);
    *(uint *)(in_RDI[1] + uVar7 * 4) = uVar1 + 1;
    *(undefined4 *)(lVar4 + (ulong)uVar1 * 4) = uVar6;
    lVar4 = in_RDI[2];
    uVar7 = (ulong)uVar2;
    uVar1 = *(uint *)(in_RDI[1] + uVar7 * 4);
    *(uint *)(in_RDI[1] + uVar7 * 4) = uVar1 + 1;
    *(undefined4 *)(lVar4 + (ulong)uVar1 * 4) = uVar6;
  }
  for (local_68 = 0; local_68 < in_RCX; local_68 = local_68 + 1) {
    *(int *)(in_RDI[1] + local_68 * 4) =
         *(int *)(in_RDI[1] + local_68 * 4) - *(int *)(*in_RDI + local_68 * 4);
  }
  return;
}

Assistant:

static void buildTriangleAdjacency(TriangleAdjacency& adjacency, const unsigned int* indices, size_t index_count, size_t vertex_count, meshopt_Allocator& allocator)
{
	size_t face_count = index_count / 3;

	// allocate arrays
	adjacency.counts = allocator.allocate<unsigned int>(vertex_count);
	adjacency.offsets = allocator.allocate<unsigned int>(vertex_count);
	adjacency.data = allocator.allocate<unsigned int>(index_count);

	// fill triangle counts
	memset(adjacency.counts, 0, vertex_count * sizeof(unsigned int));

	for (size_t i = 0; i < index_count; ++i)
	{
		assert(indices[i] < vertex_count);

		adjacency.counts[indices[i]]++;
	}

	// fill offset table
	unsigned int offset = 0;

	for (size_t i = 0; i < vertex_count; ++i)
	{
		adjacency.offsets[i] = offset;
		offset += adjacency.counts[i];
	}

	assert(offset == index_count);

	// fill triangle data
	for (size_t i = 0; i < face_count; ++i)
	{
		unsigned int a = indices[i * 3 + 0], b = indices[i * 3 + 1], c = indices[i * 3 + 2];

		adjacency.data[adjacency.offsets[a]++] = unsigned(i);
		adjacency.data[adjacency.offsets[b]++] = unsigned(i);
		adjacency.data[adjacency.offsets[c]++] = unsigned(i);
	}

	// fix offsets that have been disturbed by the previous pass
	for (size_t i = 0; i < vertex_count; ++i)
	{
		assert(adjacency.offsets[i] >= adjacency.counts[i]);

		adjacency.offsets[i] -= adjacency.counts[i];
	}
}